

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# partition_strategy.c
# Opt level: O1

void get_min_bsize(SIMPLE_MOTION_DATA_TREE *sms_tree,int *min_bw,int *min_bh)

{
  BLOCK_SIZE BVar1;
  byte bVar2;
  bool bVar3;
  ulong uVar4;
  BLOCK_SIZE BVar5;
  byte bVar6;
  uint uVar7;
  int i;
  long lVar8;
  
  if (sms_tree == (SIMPLE_MOTION_DATA_TREE *)0x0) {
    return;
  }
  BVar1 = sms_tree->block_size;
  uVar4 = (ulong)BVar1;
  if (BVar1 == BLOCK_4X4) {
    *min_bw = 0;
    uVar7 = 0;
    goto LAB_001edf82;
  }
  bVar2 = sms_tree->partitioning;
  if (bVar2 == 0xff) {
    return;
  }
  if (bVar2 == 3) {
    lVar8 = 0;
    do {
      get_min_bsize(sms_tree->split[lVar8],min_bw,min_bh);
      lVar8 = lVar8 + 1;
    } while (lVar8 != 4);
    return;
  }
  bVar6 = 3;
  if ((bVar2 & 0xfc) != 4) {
    bVar6 = bVar2;
  }
  BVar5 = BLOCK_INVALID;
  if (bVar6 != 0xff) {
    switch(BVar1) {
    case BLOCK_4X4:
      break;
    case BLOCK_4X8:
    case BLOCK_8X4:
    case BLOCK_8X16:
    case BLOCK_16X8:
    case BLOCK_16X32:
    case BLOCK_32X16:
switchD_001edeff_caseD_1:
      uVar4 = 6;
      bVar3 = true;
      goto LAB_001edf38;
    case BLOCK_8X8:
      uVar4 = 1;
      break;
    case BLOCK_16X16:
      uVar4 = 2;
      break;
    case BLOCK_32X32:
      uVar4 = 3;
      break;
    default:
      if (BVar1 == BLOCK_64X64) {
        uVar4 = 4;
      }
      else {
        if (BVar1 != BLOCK_128X128) goto switchD_001edeff_caseD_1;
        uVar4 = 5;
      }
    }
    bVar3 = false;
LAB_001edf38:
    if (!bVar3) {
      BVar5 = subsize_lookup[bVar6][uVar4];
    }
  }
  if (BVar5 == BLOCK_INVALID) {
    return;
  }
  uVar7 = (uint)""[BVar5];
  if (*min_bw < (int)(uint)""[BVar5]) {
    uVar7 = *min_bw;
  }
  *min_bw = uVar7;
  uVar7 = (uint)""[BVar5];
  if (*min_bh < (int)(uint)""[BVar5]) {
    uVar7 = *min_bh;
  }
LAB_001edf82:
  *min_bh = uVar7;
  return;
}

Assistant:

static inline void get_min_bsize(const SIMPLE_MOTION_DATA_TREE *sms_tree,
                                 int *min_bw, int *min_bh) {
  if (!sms_tree) return;

  const BLOCK_SIZE bsize = sms_tree->block_size;
  if (bsize == BLOCK_4X4) {
    *min_bw = 0;
    *min_bh = 0;
    return;
  }

  PARTITION_TYPE part_type = sms_tree->partitioning;
  if (part_type == PARTITION_INVALID) return;

  if (part_type == PARTITION_SPLIT) {
    for (int i = 0; i < SUB_PARTITIONS_SPLIT; ++i) {
      get_min_bsize(sms_tree->split[i], min_bw, min_bh);
    }
  } else {
    if (part_type == PARTITION_HORZ_A || part_type == PARTITION_HORZ_B ||
        part_type == PARTITION_VERT_A || part_type == PARTITION_VERT_B)
      part_type = PARTITION_SPLIT;
    const BLOCK_SIZE subsize = get_partition_subsize(bsize, part_type);
    if (subsize != BLOCK_INVALID) {
      *min_bw = AOMMIN(*min_bw, mi_size_wide_log2[subsize]);
      *min_bh = AOMMIN(*min_bh, mi_size_high_log2[subsize]);
    }
  }
}